

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

TriggerPrg * getRowTrigger(Parse *pParse,Trigger *pTrigger,Table *pTab,int orconf)

{
  int in_ECX;
  Trigger *in_RSI;
  long *in_RDI;
  bool bVar1;
  int in_stack_0000000c;
  Table *in_stack_00000010;
  TriggerPrg *pPrg;
  Parse *pRoot;
  long *local_38;
  TriggerPrg *local_30;
  
  local_38 = in_RDI;
  if (in_RDI[0x16] != 0) {
    local_38 = (long *)in_RDI[0x16];
  }
  local_30 = (TriggerPrg *)local_38[0x18];
  while( true ) {
    bVar1 = false;
    if ((local_30 != (TriggerPrg *)0x0) && (bVar1 = true, local_30->pTrigger == in_RSI)) {
      bVar1 = local_30->orconf != in_ECX;
    }
    if (!bVar1) break;
    local_30 = local_30->pNext;
  }
  if (local_30 == (TriggerPrg *)0x0) {
    local_30 = codeRowTrigger(pRoot,(Trigger *)pPrg,in_stack_00000010,in_stack_0000000c);
    *(undefined4 *)(*in_RDI + 0x54) = 0xffffffff;
  }
  return local_30;
}

Assistant:

static TriggerPrg *getRowTrigger(
  Parse *pParse,       /* Current parse context */
  Trigger *pTrigger,   /* Trigger to code */
  Table *pTab,         /* The table trigger pTrigger is attached to */
  int orconf           /* ON CONFLICT algorithm. */
){
  Parse *pRoot = sqlite3ParseToplevel(pParse);
  TriggerPrg *pPrg;

  assert( pTrigger->zName==0 || pTab==tableOfTrigger(pTrigger) );

  /* It may be that this trigger has already been coded (or is in the
  ** process of being coded). If this is the case, then an entry with
  ** a matching TriggerPrg.pTrigger field will be present somewhere
  ** in the Parse.pTriggerPrg list. Search for such an entry.  */
  for(pPrg=pRoot->pTriggerPrg;
      pPrg && (pPrg->pTrigger!=pTrigger || pPrg->orconf!=orconf);
      pPrg=pPrg->pNext
  );

  /* If an existing TriggerPrg could not be located, create a new one. */
  if( !pPrg ){
    pPrg = codeRowTrigger(pParse, pTrigger, pTab, orconf);
    pParse->db->errByteOffset = -1;
  }

  return pPrg;
}